

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  int iVar2;
  void **ppvVar3;
  uint8_t *puVar4;
  _Bool _Var5;
  ushort uVar6;
  int iVar7;
  int *piVar8;
  uint8_t uVar9;
  int iVar10;
  int iVar11;
  uint32_t range_end_00;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint16_t *puVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  
  uVar12 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar12 = range_end;
  }
  if (range_start < uVar12) {
    if (uVar12 - range_start == 1) {
      _Var5 = roaring_bitmap_contains(r,(uint)range_start);
      return _Var5;
    }
    lVar13 = uVar12 - 1;
    iVar10 = (int)((ulong)lVar13 >> 0x10);
    iVar7 = (int)(range_start >> 0x10);
    iVar11 = iVar10 - iVar7;
    iVar2 = (r->high_low_container).size;
    if (iVar11 < iVar2) {
      if (iVar2 == 0) {
LAB_0010b985:
        uVar17 = iVar2 - 1;
LAB_0010b989:
        if (iVar2 != 0) {
          puVar15 = (r->high_low_container).keys;
          goto LAB_0010b992;
        }
LAB_0010b99a:
        uVar18 = iVar2 - 1;
      }
      else {
        puVar15 = (r->high_low_container).keys;
        uVar6 = (ushort)(range_start >> 0x10);
        if (puVar15[(long)iVar2 + -1] == uVar6) goto LAB_0010b985;
        if (0 < iVar2) {
          iVar16 = iVar2 + -1;
          uVar18 = 0;
          do {
            uVar17 = iVar16 + uVar18 >> 1;
            uVar1 = *(ushort *)((long)puVar15 + (ulong)(iVar16 + uVar18 & 0xfffffffe));
            if (uVar1 < uVar6) {
              uVar18 = uVar17 + 1;
            }
            else {
              if (uVar1 <= uVar6) goto LAB_0010b989;
              iVar16 = uVar17 - 1;
            }
          } while ((int)uVar18 <= iVar16);
          uVar17 = ~uVar18;
          goto LAB_0010b989;
        }
        uVar17 = 0xffffffff;
LAB_0010b992:
        uVar6 = (ushort)((ulong)lVar13 >> 0x10);
        if (puVar15[(long)iVar2 + -1] == uVar6) goto LAB_0010b99a;
        if (iVar2 < 1) {
          uVar18 = 0xffffffff;
        }
        else {
          iVar16 = iVar2 + -1;
          uVar14 = 0;
          do {
            uVar18 = iVar16 + uVar14 >> 1;
            uVar1 = *(ushort *)((long)puVar15 + (ulong)(iVar16 + uVar14 & 0xfffffffe));
            if (uVar1 < uVar6) {
              uVar14 = uVar18 + 1;
            }
            else {
              if (uVar1 <= uVar6) goto LAB_0010b99e;
              iVar16 = uVar18 - 1;
            }
          } while ((int)uVar14 <= iVar16);
          uVar18 = ~uVar14;
        }
      }
LAB_0010b99e:
      if (iVar2 <= (int)uVar18) {
        return false;
      }
      if ((int)uVar18 < 0) {
        return false;
      }
      if ((int)uVar17 < 0) {
        return false;
      }
      if (uVar18 - uVar17 != iVar11) {
        return false;
      }
      uVar14 = (uint)range_start & 0xffff;
      range_end_00 = ((uint)lVar13 & 0xffff) + 1;
      ppvVar3 = (r->high_low_container).containers;
      puVar4 = (r->high_low_container).typecodes;
      if (iVar10 == iVar7) {
        _Var5 = container_contains_range
                          (ppvVar3[uVar17 & 0xffff],uVar14,range_end_00,puVar4[uVar17 & 0xffff]);
        return _Var5;
      }
      _Var5 = container_contains_range
                        (ppvVar3[uVar17 & 0xffff],uVar14,0x10000,puVar4[uVar17 & 0xffff]);
      if (_Var5) {
        _Var5 = container_contains_range
                          (ppvVar3[uVar18 & 0xffff],0,range_end_00,puVar4[uVar18 & 0xffff]);
        if (!_Var5) {
          return false;
        }
        uVar17 = uVar17 + 1;
        if (uVar17 < uVar18) {
          do {
            uVar9 = puVar4[uVar17 & 0xffff];
            piVar8 = (int *)ppvVar3[uVar17 & 0xffff];
            if (uVar9 == '\x04') {
              uVar9 = (uint8_t)piVar8[2];
              piVar8 = *(int **)piVar8;
            }
            if (uVar9 == '\x03') {
              if (*piVar8 != 1) {
                return false;
              }
              if (**(short **)(piVar8 + 2) != 0) {
                return false;
              }
              if ((*(short **)(piVar8 + 2))[1] != -1) goto LAB_0010bb28;
            }
            else if (*piVar8 != 0x10000) goto LAB_0010bb28;
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        goto LAB_0010bb23;
      }
    }
LAB_0010bb28:
    _Var5 = false;
  }
  else {
LAB_0010bb23:
    _Var5 = true;
  }
  return _Var5;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r,
                                   uint64_t range_start, uint64_t range_end) {
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end)
        return true;  // empty range are always contained!
    if (range_end - range_start == 1)
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}